

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O2

void __thiscall
POSGDiscrete::POSGDiscrete(POSGDiscrete *this,void **vtt,string *name,string *descr,string *pf)

{
  undefined1 *this_00;
  void *pvVar1;
  size_t nrAgents;
  allocator_type local_51;
  value_type local_50;
  _Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> local_48;
  
  MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
            (&this->super_MultiAgentDecisionProcessDiscrete,vtt + 1,name,descr,pf);
  this_00 = &(this->super_MultiAgentDecisionProcessDiscrete).field_0x200;
  POSG::POSG((POSG *)this_00,vtt + 6);
  pvVar1 = *vtt;
  *(void **)&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess =
       pvVar1;
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 + *(long *)((long)pvVar1 + -0x50)) = vtt[9];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[10];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0xb];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                super_MultiAgentDecisionProcess + -0x58)) = vtt[0xc];
  *(void **)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200 = vtt[0xd];
  (this->_m_p_rModel).
  super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_p_rModel).
  super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_p_rModel).
  super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_initialized = false;
  nrAgents = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                    super_MultiAgentDecisionProcess + 0x10))(this);
  POSG::SetNrAgents((POSG *)this_00,nrAgents);
  POSG::SetInitialized((POSG *)this_00,true);
  local_50 = (value_type)0x0;
  std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::vector
            ((vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> *)&local_48,
             nrAgents,&local_50,&local_51);
  std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::_M_move_assign
            (&this->_m_p_rModel,&local_48);
  std::_Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

POSGDiscrete::POSGDiscrete(
    const string &name, const string &descr, const string &pf) :
    MultiAgentDecisionProcessDiscrete(name, descr, pf)
{
    _m_initialized = false;
    size_t nrAgents = GetNrAgents();
    POSG::SetNrAgents(nrAgents);
    POSG::SetInitialized(true);
    _m_p_rModel = vector<RewardModelMapping*>(nrAgents, 0);

}